

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizerValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)602>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  int iVar1;
  undefined8 interface_00;
  bool bVar2;
  int32 modelVersion;
  int iVar3;
  CoreML *pCVar4;
  FeatureVectorizer *pFVar5;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_179;
  string local_178;
  uint64 local_158;
  uint64 size;
  FeatureVectorizer_InputColumn *element;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_13d;
  int i;
  iterator local_138;
  size_type local_130;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_128;
  Result local_110;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_e1;
  TypeCase local_e0 [4];
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  Result local_a8;
  undefined4 local_80;
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar2 = Result::good((Result *)local_48);
  if (bVar2) {
    pCVar4 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)result.m_message.field_2._8_8_);
    local_e0[0] = kInt64Type;
    local_e0[1] = 2;
    local_e0[2] = 5;
    local_e0[3] = 6;
    local_d0 = local_e0;
    local_c8 = 4;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_e1);
    __l_00._M_len = local_c8;
    __l_00._M_array = local_d0;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c0,__l_00,&local_e1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_a8,pCVar4,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0,
               (int)&local_c0,in_R8);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c0);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_e1);
    bVar2 = Result::good((Result *)local_48);
    if (bVar2) {
      pCVar4 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)result.m_message.field_2._8_8_);
      i = 5;
      local_138 = (iterator)&i;
      local_130 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_13d);
      __l._M_len = local_130;
      __l._M_array = local_138;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_128,__l,&local_13d);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_110,pCVar4,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_128,
                 in_R8);
      Result::operator=((Result *)local_48,&local_110);
      Result::~Result(&local_110);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_128);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_13d);
      bVar2 = Result::good((Result *)local_48);
      if (bVar2) {
        element._4_4_ = 0;
        while( true ) {
          iVar1 = element._4_4_;
          pFVar5 = Specification::Model::featurevectorizer(format);
          iVar3 = Specification::FeatureVectorizer::inputlist_size(pFVar5);
          if (iVar3 <= iVar1) break;
          pFVar5 = Specification::Model::featurevectorizer(format);
          size = (uint64)Specification::FeatureVectorizer::inputlist(pFVar5,element._4_4_);
          local_158 = Specification::FeatureVectorizer_InputColumn::inputdimensions
                                ((FeatureVectorizer_InputColumn *)size);
          if (local_158 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_178,"Dimension size must be greater tha zero.",&local_179);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_178);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator(&local_179);
            goto LAB_0039c5c6;
          }
          element._4_4_ = element._4_4_ + 1;
        }
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
LAB_0039c5c6:
  local_80 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_featureVectorizer>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        Result result;
        
            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             0,
                                                             {Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kMultiArrayType,
                                                                 Specification::FeatureType::kDictionaryType});
        if (!result.good()) {
            return result;
        }
        
            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
            // Validate the parameters
        for (int i = 0; i < format.featurevectorizer().inputlist_size(); i++) {
            auto& element = format.featurevectorizer().inputlist(i);
            auto size = element.inputdimensions();
            if (size <= 0) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Dimension size must be greater tha zero.");
            }
        }
        
        return result;
    }